

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O0

void absl::lts_20250127::container_internal::ResetCtrl(CommonFields *common,size_t slot_size)

{
  size_t sVar1;
  ctrl_t *__s;
  size_t sVar2;
  void *m;
  ctrl_t *ctrl;
  size_t capacity;
  size_t slot_size_local;
  CommonFields *common_local;
  
  sVar1 = CommonFields::capacity(common);
  __s = CommonFields::control(common);
  sVar2 = NumClonedBytes();
  memset(__s,0x80,sVar1 + 1 + sVar2);
  __s[sVar1] = kSentinel;
  m = CommonFields::slot_array(common);
  SanitizerPoisonMemoryRegion(m,slot_size * sVar1);
  return;
}

Assistant:

inline void ResetCtrl(CommonFields& common, size_t slot_size) {
  const size_t capacity = common.capacity();
  ctrl_t* ctrl = common.control();
  std::memset(ctrl, static_cast<int8_t>(ctrl_t::kEmpty),
              capacity + 1 + NumClonedBytes());
  ctrl[capacity] = ctrl_t::kSentinel;
  SanitizerPoisonMemoryRegion(common.slot_array(), slot_size * capacity);
}